

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O1

uint __thiscall duel::pickCard(duel *this,hand *hand__,bool blast)

{
  int iVar1;
  _Alloc_hider __nptr;
  bool bVar2;
  ostream *poVar3;
  int *piVar4;
  ulong uVar5;
  undefined8 uVar6;
  string temp;
  char *local_78;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Play a card: ",0xd);
  hand::printHand_abi_cxx11_(&local_50,hand__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (blast) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pick a card from your opponent\'s hand from ",0x2b);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," to ",4);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," to discard.",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pick a card between ",0x14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," .",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar5 = 0;
  do {
    if (((int)uVar5 != 0) &&
       ((uVar5 & 0xffffffff) <=
        (ulong)(((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4) * -0x5555555555555555))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return (int)uVar5 - 1;
    }
    std::operator>>((istream *)&std::cin,(string *)&local_70);
    bVar2 = is_number(&local_70);
    __nptr._M_p = local_70._M_dataplus._M_p;
    if (bVar2) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      uVar5 = strtol(__nptr._M_p,&local_78,10);
      if (local_78 == __nptr._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_001049c9:
        uVar6 = std::__throw_out_of_range("stoi");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar6);
      }
      if (((long)(int)uVar5 != uVar5) || (*piVar4 == 0x22)) goto LAB_001049c9;
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
    }
    if (((int)uVar5 == 0) ||
       ((ulong)(((long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(hand__->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
        (uVar5 & 0xffffffff))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"card must be between ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," .",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  } while( true );
}

Assistant:

unsigned int duel::pickCard(hand& hand__,bool blast) {
    cout << "Play a card: ";
    // list the player's hand
    hand__.printHand();
    string temp;
    unsigned int position = 0;
    if(blast) cout << "Pick a card from your opponent's hand from " << 1 << " to " << hand__.hand_.size()<< " to discard." << endl;
    else cout << "Pick a card between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
    // repeats if position is out of bounds
    while (!((1 <= position) && (position <= hand__.hand_.size()))) {
        cin >> temp;
        if (is_number(temp)) position = static_cast<unsigned int>(stoi(temp));
        if (!((1 <= position) && (position <= hand__.hand_.size()))) {
            cout << "card must be between " << 1 << " and " << hand__.hand_.size() << " ." << endl;
        }
    }
    return (position-1);
}